

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_encoder.c
# Opt level: O1

aom_codec_err_t aom_codec_enc_config_set(aom_codec_ctx_t *ctx,aom_codec_enc_cfg_t *cfg)

{
  aom_codec_iface_t *paVar1;
  aom_codec_err_t aVar2;
  
  aVar2 = AOM_CODEC_INVALID_PARAM;
  if ((((ctx != (aom_codec_ctx_t *)0x0) && (paVar1 = ctx->iface, paVar1 != (aom_codec_iface_t *)0x0)
       ) && (cfg != (aom_codec_enc_cfg_t *)0x0 &&
             (aom_codec_alg_priv_t_conflict *)ctx->priv != (aom_codec_alg_priv_t_conflict *)0x0)) &&
     (aVar2 = AOM_CODEC_INCAPABLE, (paVar1->caps & 2) != 0)) {
    aVar2 = (*(paVar1->enc).cfg_set)((aom_codec_alg_priv_t_conflict *)ctx->priv,cfg);
  }
  if (ctx != (aom_codec_ctx_t *)0x0) {
    ctx->err = aVar2;
  }
  return aVar2;
}

Assistant:

aom_codec_err_t aom_codec_enc_config_set(aom_codec_ctx_t *ctx,
                                         const aom_codec_enc_cfg_t *cfg) {
  aom_codec_err_t res;

  if (!ctx || !ctx->iface || !ctx->priv || !cfg)
    res = AOM_CODEC_INVALID_PARAM;
  else if (!(ctx->iface->caps & AOM_CODEC_CAP_ENCODER))
    res = AOM_CODEC_INCAPABLE;
  else
    res = ctx->iface->enc.cfg_set(get_alg_priv(ctx), cfg);

  return SAVE_STATUS(ctx, res);
}